

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_sdctr_setiv(ssh_cipher *ciph,void *viv)

{
  bool bVar1;
  ssh_cipheralg *psVar2;
  uint i;
  uint8_t *iv;
  des3_sdctr_ctx *ctx;
  void *viv_local;
  ssh_cipher *ciph_local;
  
  bVar1 = false;
  while (!bVar1) {
    psVar2 = (ssh_cipheralg *)GET_64BIT_MSB_FIRST(viv);
    ciph[-1].vt = psVar2;
    bVar1 = true;
  }
  return;
}

Assistant:

static void des3_sdctr_setiv(ssh_cipher *ciph, const void *viv)
{
    struct des3_sdctr_ctx *ctx = container_of(
        ciph, struct des3_sdctr_ctx, ciph);
    const uint8_t *iv = (const uint8_t *)viv;

    /* Import the initial counter value into the internal representation */
    for (unsigned i = 0; i < SDCTR_WORDS; i++)
        ctx->counter[i] = GET_BIGNUMINT_MSB_FIRST(
            iv + 8 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES);
}